

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.h
# Opt level: O2

void __thiscall QString::QString(QString *this,QLatin1StringView latin1)

{
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  qsizetype in_RCX;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  fromLatin1((QString *)&local_38,(QString *)latin1.m_data,(char *)latin1.m_size,in_RCX);
  qVar3 = local_38.size;
  pcVar2 = local_38.ptr;
  pDVar1 = local_38.d;
  local_38.d = (Data *)0x0;
  local_38.ptr = (char16_t *)0x0;
  (this->d).d = pDVar1;
  (this->d).ptr = pcVar2;
  local_38.size = 0;
  (this->d).size = qVar3;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QString::QString(QLatin1StringView latin1)
    : QString{QString::fromLatin1(latin1.data(), latin1.size())} {}